

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
tonk::MakeUniqueNoThrow<tonk::NATHolePuncher,tonk::protocol::P2PConnectParams_const&>
          (P2PConnectParams *args)

{
  void *pvVar1;
  NATHolePuncher *in_RDI;
  _Head_base<0UL,_tonk::NATHolePuncher_*,_false> this;
  
  this._M_head_impl = in_RDI;
  pvVar1 = operator_new(0x68,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    NATHolePuncher::NATHolePuncher(this._M_head_impl,&in_RDI->StartParams);
  }
  std::unique_ptr<tonk::NATHolePuncher,std::default_delete<tonk::NATHolePuncher>>::
  unique_ptr<std::default_delete<tonk::NATHolePuncher>,void>
            ((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
             this._M_head_impl,in_RDI);
  return (__uniq_ptr_data<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>,_true,_true>
          )(tuple<tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>)
           this._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}